

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_lan.c
# Opt level: O3

void olsrv2_lan_cleanup(void)

{
  avl_node *paVar1;
  avl_node *node;
  
  node = (avl_node *)_lan_tree.list_head.next;
  if ((_lan_tree.list_head.next)->prev != _lan_tree.list_head.prev) {
    do {
      paVar1 = (avl_node *)(node->list).next;
      avl_remove(&_lan_tree,node);
      oonf_class_free(&_lan_class,&node[-1].parent);
      node = paVar1;
    } while ((paVar1->list).prev != _lan_tree.list_head.prev);
  }
  oonf_class_remove(&_lan_class);
  return;
}

Assistant:

void
olsrv2_lan_cleanup(void) {
  struct olsrv2_lan_entry *entry, *e_it;

  /* remove all originator entries */
  avl_for_each_element_safe(&_lan_tree, entry, _node, e_it) {
    _remove(entry);
  }

  /* remove class */
  oonf_class_remove(&_lan_class);
}